

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_registry.hpp
# Opt level: O0

service * asio::detail::service_registry::create<asio::detail::scheduler,asio::execution_context>
                    (void *owner)

{
  scheduler *this;
  void *owner_local;
  
  this = (scheduler *)operator_new(0xf0);
  scheduler::scheduler(this,(execution_context *)owner,0);
  return (service *)this;
}

Assistant:

execution_context::service* service_registry::create(void* owner)
{
  return new Service(*static_cast<Owner*>(owner));
}